

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# karatsubaMultiplication.cpp
# Opt level: O0

Num * __thiscall
karatsubaMultiplication::multiply
          (Num *__return_storage_ptr__,karatsubaMultiplication *this,Num *n1,Num *n2)

{
  Short SVar1;
  Short SVar2;
  Short SVar3;
  unsigned_short *puVar4;
  Num local_4b0;
  Num local_488;
  undefined1 local_459;
  undefined1 local_458 [8];
  Num tk2;
  Num t_2m;
  Num tk1;
  string str_t;
  undefined1 local_3b8 [4];
  int t_x2;
  Num local_390;
  Num local_368;
  Num local_340;
  __cxx11 local_318 [32];
  Num local_2f8;
  int local_2cc;
  undefined1 local_2c8 [4];
  int per1;
  Num b_b;
  Num local_280;
  int local_254;
  undefined1 local_250 [4];
  int per;
  Num a_a;
  undefined1 local_200 [8];
  Num x3;
  Num x2;
  Num x1;
  Halves local_138;
  undefined1 local_e8 [8];
  Halves b;
  Halves a;
  gradeSchoolMultiplication local_38;
  gradeSchoolMultiplication t;
  Short m;
  Num *n2_local;
  Num *n1_local;
  karatsubaMultiplication *this_local;
  Num *x4;
  
  t.super_Multiplicator._vptr_Multiplicator._4_2_ = Num::getSize(n1);
  t.super_Multiplicator._vptr_Multiplicator._2_2_ = Num::getSize(n2);
  puVar4 = std::max<unsigned_short>
                     ((unsigned_short *)((long)&t.super_Multiplicator._vptr_Multiplicator + 4),
                      (unsigned_short *)((long)&t.super_Multiplicator._vptr_Multiplicator + 2));
  t.super_Multiplicator._vptr_Multiplicator._6_2_ = *puVar4;
  SVar1 = Num::getSize(n1);
  if ((SVar1 == 1) || (SVar1 = Num::getSize(n2), SVar1 == 1)) {
    gradeSchoolMultiplication::gradeSchoolMultiplication(&local_38);
    gradeSchoolMultiplication::multiply(__return_storage_ptr__,&local_38,n1,n2);
    gradeSchoolMultiplication::~gradeSchoolMultiplication(&local_38);
  }
  else {
    std::pair<Num,_Num>::pair<Num,_Num,_true>((pair<Num,_Num> *)&b.second.field_0x20);
    std::pair<Num,_Num>::pair<Num,_Num,_true>((pair<Num,_Num> *)local_e8);
    Num::getHalf(&local_138,n1,t.super_Multiplicator._vptr_Multiplicator._6_2_);
    std::pair<Num,_Num>::operator=((pair<Num,_Num> *)&b.second.field_0x20,&local_138);
    std::pair<Num,_Num>::~pair(&local_138);
    Num::getHalf((Halves *)&x1.field_0x20,n2,t.super_Multiplicator._vptr_Multiplicator._6_2_);
    std::pair<Num,_Num>::operator=((pair<Num,_Num> *)local_e8,(type)&x1.field_0x20);
    std::pair<Num,_Num>::~pair((pair<Num,_Num> *)&x1.field_0x20);
    Num::Num((Num *)&x2.field_0x20);
    Num::Num((Num *)&x3.field_0x20);
    Num::Num((Num *)local_200);
    multiply((Num *)&a_a.field_0x20,this,(Num *)&b.second.field_0x20,(Num *)local_e8);
    Num::operator=((Num *)&x2.field_0x20,(Num *)&a_a.field_0x20);
    Num::~Num((Num *)&a_a.field_0x20);
    Num::Num((Num *)local_250);
    SVar1 = Num::getNumber((Num *)&b.second.field_0x20);
    SVar2 = Num::getNumber((Num *)&a.first.field_0x20);
    local_254 = (uint)SVar1 + (uint)SVar2;
    Num::operator+(&local_280,(Num *)&b.second.field_0x20,(Num *)&a.first.field_0x20);
    local_250._0_2_ = Num::getSize(&local_280);
    Num::~Num(&local_280);
    std::__cxx11::to_string((__cxx11 *)&b_b.field_0x20,local_254);
    std::__cxx11::string::operator=((string *)&a_a,(string *)&b_b.field_0x20);
    std::__cxx11::string::~string((string *)&b_b.field_0x20);
    Num::Num((Num *)local_2c8);
    SVar1 = Num::getNumber((Num *)local_e8);
    SVar2 = Num::getNumber((Num *)&b.first.field_0x20);
    local_2cc = (uint)SVar1 + (uint)SVar2;
    Num::operator+(&local_2f8,(Num *)local_e8,(Num *)&b.first.field_0x20);
    local_2c8._0_2_ = Num::getSize(&local_2f8);
    Num::~Num(&local_2f8);
    std::__cxx11::to_string(local_318,local_2cc);
    std::__cxx11::string::operator=((string *)&b_b,(string *)local_318);
    std::__cxx11::string::~string((string *)local_318);
    Num::operator+(&local_368,(Num *)&b.second.field_0x20,(Num *)&a.first.field_0x20);
    Num::operator+(&local_390,(Num *)local_e8,(Num *)&b.first.field_0x20);
    multiply(&local_340,this,&local_368,&local_390);
    Num::operator=((Num *)&x3.field_0x20,&local_340);
    Num::~Num(&local_340);
    Num::~Num(&local_390);
    Num::~Num(&local_368);
    multiply((Num *)local_3b8,this,(Num *)&a.first.field_0x20,(Num *)&b.first.field_0x20);
    Num::operator=((Num *)local_200,(Num *)local_3b8);
    Num::~Num((Num *)local_3b8);
    SVar1 = Num::getNumber((Num *)&x3.field_0x20);
    SVar2 = Num::getNumber((Num *)&x2.field_0x20);
    SVar3 = Num::getNumber((Num *)local_200);
    std::__cxx11::to_string((__cxx11 *)&tk1.field_0x20,((uint)SVar1 - (uint)SVar2) - (uint)SVar3);
    Num::multiplyByPowerOfTen
              ((Num *)&t_2m.field_0x20,(Num *)&x2.field_0x20,
               t.super_Multiplicator._vptr_Multiplicator._6_2_);
    SVar1 = std::__cxx11::string::size();
    Num::Num((Num *)&tk2.field_0x20,(string *)&tk1.field_0x20,SVar1);
    if ((uint)t.super_Multiplicator._vptr_Multiplicator._6_2_ % 2 != 0) {
      t.super_Multiplicator._vptr_Multiplicator._6_2_ =
           t.super_Multiplicator._vptr_Multiplicator._6_2_ - 1;
    }
    Num::multiplyByPowerOfTen
              ((Num *)local_458,(Num *)&tk2.field_0x20,
               t.super_Multiplicator._vptr_Multiplicator._6_2_ >> 1);
    local_459 = 0;
    Num::multiplyByPowerOfTen
              (&local_4b0,(Num *)&tk2.field_0x20,
               t.super_Multiplicator._vptr_Multiplicator._6_2_ >> 1);
    Num::operator+(&local_488,(Num *)&t_2m.field_0x20,&local_4b0);
    Num::operator+(__return_storage_ptr__,&local_488,(Num *)local_200);
    Num::~Num(&local_488);
    Num::~Num(&local_4b0);
    local_459 = 1;
    Num::~Num((Num *)local_458);
    Num::~Num((Num *)&tk2.field_0x20);
    Num::~Num((Num *)&t_2m.field_0x20);
    std::__cxx11::string::~string((string *)&tk1.field_0x20);
    Num::~Num((Num *)local_2c8);
    Num::~Num((Num *)local_250);
    Num::~Num((Num *)local_200);
    Num::~Num((Num *)&x3.field_0x20);
    Num::~Num((Num *)&x2.field_0x20);
    std::pair<Num,_Num>::~pair((pair<Num,_Num> *)local_e8);
    std::pair<Num,_Num>::~pair((pair<Num,_Num> *)&b.second.field_0x20);
  }
  return __return_storage_ptr__;
}

Assistant:

Num karatsubaMultiplication :: multiply(const Num& n1, const Num& n2)
{
    Short m = std::max(n1.getSize(), n2.getSize());
    if (n1.getSize() == 1 || n2.getSize()== 1)
    {
        gradeSchoolMultiplication t;
        return t.multiply(n1, n2);
    }

    Halves a, b;
    a = n1.getHalf(m);
    b = n2.getHalf(m);

    Num x1, x2, x3;
    x1 = karatsubaMultiplication ::multiply(a.first, b.first);
    Num a_a;
    int per = a.first.getNumber() + a.second.getNumber();
    a_a.size = (a.first + a.second).getSize();
    a_a.base = std::to_string(per);

    Num b_b;
    int per1 = b.first.getNumber() + b.second.getNumber();
    b_b.size = (b.first + b.second).getSize();
    b_b.base = std::to_string(per1);

    x2 = karatsubaMultiplication ::multiply(a.first + a.second, b.first + b.second);
    x3 = karatsubaMultiplication ::multiply(a.second, b.second);

    int t_x2 = x2.getNumber() - x1.getNumber() - x3.getNumber();

    std::string str_t = std::to_string(t_x2);


    Num tk1 = x1.multiplyByPowerOfTen(m);
    Num t_2m (str_t, str_t.size());

    if (m % 2)
    {
        --m;
    }

    Num tk2 = t_2m.multiplyByPowerOfTen(m/2);

    Num x4 =  tk1 + (t_2m).multiplyByPowerOfTen(m / 2) + x3;

    return x4;
}